

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O0

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted,Array4<const_double> *eb_velocity,
               Array4<const_double> *values_on_eb_inflow,Array4<const_amrex::EBCellFlag> *flag_arr,
               Array4<const_double> *barea,Array4<const_double> *bnorm)

{
  bool bVar1;
  void *in_RSI;
  void *in_R9;
  CoordSys *in_stack_00000010;
  Array4 *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  GpuArray<double,_3U> *dxinv;
  undefined1 local_240 [40];
  anon_class_480_9_4bdc6195 *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  Box *in_stack_fffffffffffffdf8;
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined1 auStack_180 [64];
  undefined1 auStack_140 [64];
  undefined1 auStack_100 [63];
  bool in_stack_ffffffffffffff3f;
  Real in_stack_ffffffffffffff40;
  Array4<const_double> *in_stack_ffffffffffffff48;
  Array4<const_double> *in_stack_ffffffffffffff50;
  Array4<const_double> *in_stack_ffffffffffffff58;
  Array4<const_double> *in_stack_ffffffffffffff60;
  Array4<double> *in_stack_ffffffffffffff68;
  Box *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffb0;
  Geometry *in_stack_ffffffffffffffb8;
  
  EB_ComputeDivergence
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3f);
  bVar1 = amrex::Array4::operator_cast_to_bool(in_stack_00000020);
  if (bVar1) {
    amrex::CoordSys::InvCellSizeArray
              ((GpuArray<double,_3U> *)&stack0xffffffffffffffa0,in_stack_00000010);
    memcpy(local_240,in_RSI,0x3c);
    memcpy(auStack_200,in_stack_00000020,0x3c);
    memcpy(auStack_1c0,in_stack_00000028,0x3c);
    memcpy(auStack_180,in_stack_00000030,0x3c);
    memcpy(auStack_140,in_stack_00000038,0x3c);
    memcpy(auStack_100,in_R9,0x3c);
    memcpy(&stack0xffffffffffffff40,in_stack_00000040,0x3c);
    amrex::
    ParallelFor<int,HydroUtils::EB_ComputeDivergence(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int,amrex::Geometry_const&,double,bool,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&)::__0,void>
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted,
                                   Array4<Real const> const& eb_velocity,
                                   Array4<Real const> const& values_on_eb_inflow,
                                   Array4<EBCellFlag const> const& flag_arr,
                                   Array4<Real const> const& barea,
                                   Array4<Real const> const& bnorm)
{

    // Compute the standard EB divergence term
    EB_ComputeDivergence(bx, div, AMREX_D_DECL(fx, fy, fz),
                         vfrac, ncomp, geom, mult, fluxes_are_area_weighted);

    if( eb_velocity ) {

        AMREX_ASSERT( values_on_eb_inflow );

        const auto &dxinv = geom.InvCellSizeArray();

        amrex::ParallelFor(bx, ncomp, [div,eb_velocity,values_on_eb_inflow,
          flag_arr,barea,vfrac,bnorm,dxinv,mult]
          AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
         if (flag_arr(i,j,k).isSingleValued()) {

           Real Ueb_dot_n = (AMREX_D_TERM(
                                eb_velocity(i,j,k,0)*bnorm(i,j,k,0),
                              + eb_velocity(i,j,k,1)*bnorm(i,j,k,1),
                              + eb_velocity(i,j,k,2)*bnorm(i,j,k,2)));

           div(i,j,k,n) += (mult / vfrac(i,j,k)) *
              values_on_eb_inflow(i,j,k,n) * Ueb_dot_n * barea(i,j,k) * dxinv[0];

         }
        });
     }
}